

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O2

_Bool al_set_window_constraints(ALLEGRO_DISPLAY *display,int min_w,int min_h,int max_w,int max_h)

{
  _func__Bool_ALLEGRO_DISPLAY_ptr_int_int_int_int *UNRECOVERED_JUMPTABLE;
  _Bool _Var1;
  
  if ((((-1 < (min_h | min_w | max_w | max_h)) && (((min_w <= max_w || (min_w < 1)) || (max_w < 1)))
       ) && ((((min_h <= max_h || (min_h < 1)) || (max_h < 1)) &&
             ((display != (ALLEGRO_DISPLAY *)0x0 && ((display->flags & 0x12U) == 0x10)))))) &&
     ((display->vt != (ALLEGRO_DISPLAY_INTERFACE *)0x0 &&
      (UNRECOVERED_JUMPTABLE = display->vt->set_window_constraints,
      UNRECOVERED_JUMPTABLE != (_func__Bool_ALLEGRO_DISPLAY_ptr_int_int_int_int *)0x0)))) {
    _Var1 = (*UNRECOVERED_JUMPTABLE)(display,min_w,min_h,max_w,max_h);
    return _Var1;
  }
  return false;
}

Assistant:

bool al_set_window_constraints(ALLEGRO_DISPLAY *display,
   int min_w, int min_h, int max_w, int max_h)
{
   ASSERT(display);

  /* Perform some basic checks. */
   if (min_w < 0 || min_h < 0 || max_w < 0 || max_h < 0) {
      return false;
   }
   if (min_w > 0 && max_w > 0 && max_w < min_w) {
      return false;
   }
   if (min_h > 0 && max_h > 0 && max_h < min_h) {
      return false;
   }

   /* Cannot constrain when fullscreen. */
   if (display->flags & ALLEGRO_FULLSCREEN) {
      return false;
   }

   /* Cannot constrain if not resizable. */
   if (!(display->flags & ALLEGRO_RESIZABLE)) {
      return false;
   }

   if (display && display->vt && display->vt->set_window_constraints) {
      return display->vt->set_window_constraints(display, min_w, min_h,
         max_w, max_h);
   }
   else {
      return false;
   }
}